

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

HFFilteredConsumer * __thiscall
MlmWrap::createFilteredConsumer
          (MlmWrap *this,HighFreqDataType *dt,size_t buffersize,hfs_data_filter_fn *filter,
          HFParsingInfo *parser)

{
  SubType SVar1;
  HFFilteredConsumer *this_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  HighFreqDataType *in_RSI;
  HFSubSockSettings *in_RDI;
  HighFreqDataType *in_R8;
  HFSubSockSettings sockInfo;
  HFFilteredConsumer *newsub;
  HighFreqSub *in_stack_fffffffffffffcc8;
  MlmWrap *in_stack_fffffffffffffcd0;
  SubType type;
  HFFilteredConsumer *this_01;
  HFParsingInfo *in_stack_fffffffffffffda0;
  hfs_data_filter_fn *in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdb4;
  HighFreqDataType *in_stack_fffffffffffffdb8;
  HFFilteredConsumer *in_stack_fffffffffffffdc0;
  HFSubSockSettings *in_stack_fffffffffffffdd0;
  MlmWrap *in_stack_fffffffffffffdd8;
  
  type = (SubType)((ulong)in_RCX >> 0x20);
  this_00 = (HFFilteredConsumer *)operator_new(0x420);
  HighFreqDataType::HighFreqDataType((HighFreqDataType *)this_00,in_RSI);
  HFParsingInfo::HFParsingInfo((HFParsingInfo *)in_RDI,(HFParsingInfo *)in_R8);
  HFFilteredConsumer::HFFilteredConsumer
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb4,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  HFParsingInfo::~HFParsingInfo((HFParsingInfo *)in_stack_fffffffffffffcd0);
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffcd0);
  this_01 = this_00;
  addSubToList(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  HighFreqDataType::HighFreqDataType((HighFreqDataType *)this_01,in_RSI);
  SVar1 = HighFreqSub::getSubSockType((HighFreqSub *)this_00);
  HFSubSockSettings::HFSubSockSettings
            (in_RDI,in_R8,type,(hfs_data_callback_fn)CONCAT44(in_EDX,SVar1),
             in_stack_fffffffffffffcd0);
  HighFreqDataType::~HighFreqDataType((HighFreqDataType *)in_stack_fffffffffffffcd0);
  HFSubSockSettings::HFSubSockSettings
            ((HFSubSockSettings *)in_stack_fffffffffffffcd0,
             (HFSubSockSettings *)in_stack_fffffffffffffcc8);
  addHfTypeToSubbedList(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x369de7);
  HFSubSockSettings::~HFSubSockSettings((HFSubSockSettings *)0x369e01);
  return this_00;
}

Assistant:

HFFilteredConsumer* MlmWrap::createFilteredConsumer(HighFreqDataType dt, size_t buffersize, hfs_data_filter_fn* filter, HFParsingInfo parser){
    HFFilteredConsumer *newsub = new HFFilteredConsumer(dt, buffersize, filter, parser);
    addSubToList(newsub);
    HFSubSockSettings sockInfo(dt, newsub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    return newsub;
}